

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double baseline_err_per_mb(FRAME_INFO *frame_info)

{
  uint screen_area;
  FRAME_INFO *frame_info_local;
  double local_8;
  
  if ((uint)(frame_info->frame_height * frame_info->frame_width) < 0x38401) {
    local_8 = 500.0;
  }
  else {
    local_8 = 1000.0;
  }
  return local_8;
}

Assistant:

static double baseline_err_per_mb(const FRAME_INFO *frame_info) {
  unsigned int screen_area = frame_info->frame_height * frame_info->frame_width;

  // Use a different error per mb factor for calculating boost for
  //  different formats.
  if (screen_area <= 640 * 360) {
    return 500.0;
  } else {
    return 1000.0;
  }
}